

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::erase
          (ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this,Iterator start_it,
          Iterator end_it)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong local_40;
  size_t cur;
  size_t size;
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this_local;
  Iterator end_it_local;
  Iterator start_it_local;
  
  uVar3 = end_it.index;
  local_40 = start_it.index;
  if (&(start_it.parent)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> !=
      &(end_it.parent)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> ||
      &(start_it.parent)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> != this) {
    __assert_fail("start_it.parent == end_it.parent && start_it.parent == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                  ,0xe8,
                  "void ArenaVectorBase<cashew::ArrayStorage, cashew::Ref>::erase(Iterator, Iterator) [SubType = cashew::ArrayStorage, T = cashew::Ref]"
                 );
  }
  bVar1 = false;
  if (local_40 <= uVar3) {
    bVar1 = uVar3 <= this->usedElements;
  }
  if (!bVar1) {
    __assert_fail("start_it.index <= end_it.index && end_it.index <= usedElements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                  ,0xe9,
                  "void ArenaVectorBase<cashew::ArrayStorage, cashew::Ref>::erase(Iterator, Iterator) [SubType = cashew::ArrayStorage, T = cashew::Ref]"
                 );
  }
  lVar2 = uVar3 - local_40;
  for (; local_40 + lVar2 < this->usedElements; local_40 = local_40 + 1) {
    this->data[local_40].inst = this->data[local_40 + lVar2].inst;
  }
  this->usedElements = this->usedElements - lVar2;
  return;
}

Assistant:

void erase(Iterator start_it, Iterator end_it) {
    assert(start_it.parent == end_it.parent && start_it.parent == this);
    assert(start_it.index <= end_it.index && end_it.index <= usedElements);
    size_t size = end_it.index - start_it.index;
    for (size_t cur = start_it.index; cur + size < usedElements; ++cur) {
      data[cur] = data[cur + size];
    }
    usedElements -= size;
  }